

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

bool __thiscall cmQtAutoGenInitializer::InitAutogenTarget(cmQtAutoGenInitializer *this)

{
  UicT *genVars;
  anon_struct_696_16_37873454_for_AutogenTarget *utilityName;
  bool bVar1;
  uint uVar2;
  pointer ppVar3;
  pointer pcVar4;
  tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_> this_00;
  cmGeneratorTarget *this_01;
  cmGeneratorTarget *this_02;
  pointer pcVar5;
  cmLocalGenerator *pcVar6;
  pointer pbVar7;
  pointer ppVar8;
  string_view suffix;
  __single_object _Var9;
  _Alloc_hider this_03;
  TargetType TVar10;
  long lVar11;
  string *psVar12;
  string *psVar13;
  _Rb_tree_node_base *p_Var14;
  cmLinkImplementationLibraries *pcVar15;
  mapped_type *pmVar16;
  undefined8 uVar17;
  mapped_type *pmVar18;
  cmTarget *pcVar19;
  set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
  *psVar20;
  _Base_ptr p_Var21;
  pointer pcVar22;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *uiFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_04;
  pointer filename;
  pointer __x;
  undefined4 uVar23;
  undefined8 unaff_RBP;
  cmLinkItem *item;
  undefined7 uVar24;
  __node_base *p_Var25;
  _Alloc_hider _Var26;
  pointer pbVar27;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar28;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_01;
  string_view prefix;
  __single_object cc_3;
  __single_object cc_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_540;
  GenVarsT *local_530;
  pointer local_528;
  string *local_520;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uicDependencies;
  string timestampFileGenex;
  cmCustomCommandLines commandLines;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> local_480;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> local_478;
  cmTarget *timestampTarget;
  undefined4 local_464;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependencies;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_448;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_440;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_438;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_430;
  string configView;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  autogenByproducts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  timestampByproducts;
  cmGeneratorTarget *libTarget;
  char *local_3c8;
  string autogenComment;
  undefined1 local_380 [16];
  string tools;
  pointer local_350;
  pointer local_348;
  __node_base local_340;
  pointer pbStack_338;
  float local_330;
  pointer local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> abStack_320 [6];
  bool local_242;
  __buckets_ptr local_230;
  char *pcStack_228;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tempTimestampFileName;
  string depFileWithoutConfig;
  string local_f0;
  string depFileWithConfig;
  string timestampFileName;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tempDepFile;
  
  psVar13 = &(this->AutogenTarget).InfoFile;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->Makefile->OutputFiles,psVar13);
  (*this->GlobalGen->_vptr_cmGlobalGenerator[3])(&tools);
  uVar2 = (this->QtVersion).Major;
  if (uVar2 < 6) {
    unaff_RBP = 0;
    uVar23 = 0;
    if ((uVar2 == 5) && (0xe < (this->QtVersion).Minor)) goto LAB_00476ad1;
  }
  else {
LAB_00476ad1:
    lVar11 = std::__cxx11::string::find((char *)&tools,0x6a0f89);
    uVar24 = (undefined7)((ulong)unaff_RBP >> 8);
    uVar23 = (undefined4)CONCAT71(uVar24,1);
    if (lVar11 == -1) {
      lVar11 = std::__cxx11::string::find((char *)&tools,0x6de5fc);
      uVar23 = (undefined4)CONCAT71(uVar24,lVar11 != -1);
    }
  }
  std::__cxx11::string::~string((string *)&tools);
  autogenByproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  autogenByproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  autogenByproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  timestampByproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  timestampByproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  timestampByproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_530 = &(this->Moc).super_GenVarsT;
  if ((this->Moc).super_GenVarsT.Enabled == true) {
    AddGeneratedSource(this,&(this->Moc).CompilationFile,local_530,true);
    if ((char)uVar23 == '\0') {
      this_04 = &autogenByproducts;
    }
    else {
      this_04 = &timestampByproducts;
      if (this->CrossConfig == true) {
        (*this->GlobalGen->_vptr_cmGlobalGenerator[3])(&tools);
        lVar11 = std::__cxx11::string::find((char *)&tools,0x6a0f89);
        bVar1 = this->UseBetterGraph;
        std::__cxx11::string::~string((string *)&tools);
        if ((lVar11 != -1) && ((bVar1 & 1U) == 0)) {
          p_Var25 = &(this->Moc).CompilationFile.Config._M_h._M_before_begin;
          while (p_Var25 = p_Var25->_M_nxt, p_Var25 != (__node_base *)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&timestampByproducts,(value_type *)(p_Var25 + 5));
          }
          goto LAB_00476c26;
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_04,&(this->Moc).CompilationFileGenex);
  }
LAB_00476c26:
  genVars = &this->Uic;
  local_464 = uVar23;
  if ((this->Uic).super_GenVarsT.Enabled == true) {
    ppVar3 = (this->Uic).UiHeaders.
             super__Vector_base<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (filename = (this->Uic).UiHeaders.
                    super__Vector_base<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; filename != ppVar3;
        filename = filename + 1) {
      AddGeneratedSource(this,&filename->first,&genVars->super_GenVarsT,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&autogenByproducts,&filename->second);
    }
  }
  autogenComment._M_dataplus._M_p = (pointer)&autogenComment.field_2;
  autogenComment._M_string_length = 0;
  tools._M_dataplus._M_p = (pointer)&tools.field_2;
  tools._M_string_length = 0;
  autogenComment.field_2._M_local_buf[0] = '\0';
  tools.field_2._M_allocated_capacity = tools.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (((GenVarsT *)&local_530->Enabled)->Enabled == true) {
    std::__cxx11::string::append((char *)&tools);
  }
  if ((genVars->super_GenVarsT).Enabled == true) {
    if (tools._M_string_length != 0) {
      std::__cxx11::string::append((char *)&tools);
    }
    std::__cxx11::string::append((char *)&tools);
  }
  psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
  cmStrCat<char_const(&)[11],std::__cxx11::string&,char_const(&)[13],std::__cxx11::string_const&>
            ((string *)&uicDependencies,(char (*) [11])"Automatic ",&tools,(char (*) [13])0x6cda08,
             psVar12);
  std::__cxx11::string::operator=((string *)&autogenComment,(string *)&uicDependencies);
  std::__cxx11::string::~string((string *)&uicDependencies);
  std::__cxx11::string::~string((string *)&tools);
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tools,"cmake_autogen",(allocator<char> *)&uicDependencies);
  AddCMakeProcessToCommandLines(this,psVar13,&tools,&commandLines);
  std::__cxx11::string::~string((string *)&tools);
  (*this->GlobalGen->_vptr_cmGlobalGenerator[3])(&tools);
  lVar11 = std::__cxx11::string::find((char *)&tools,0x69ac49);
  std::__cxx11::string::~string((string *)&tools);
  if (((lVar11 == -1) || ((this->AutogenTarget).GlobalTarget != false)) ||
     ((this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    if ((this->AutogenTarget).DependOrigin == true) {
      timestampFileGenex.field_2._8_8_ = &timestampFileGenex._M_string_length;
      timestampFileGenex._M_string_length = timestampFileGenex._M_string_length & 0xffffffff00000000
      ;
      timestampFileGenex.field_2._M_allocated_capacity = 0;
      psVar12 = (this->ConfigsList).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      psVar13 = (this->ConfigsList).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      while (psVar13 != psVar12) {
        local_520 = psVar13;
        pcVar15 = cmGeneratorTarget::GetLinkImplementationLibraries(this->GenTarget,psVar13,Link);
        if (pcVar15 != (cmLinkImplementationLibraries *)0x0) {
          pcVar4 = (pcVar15->Libraries).
                   super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pcVar22 = (pcVar15->Libraries).
                         super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl
                         .super__Vector_impl_data._M_start; pcVar22 != pcVar4; pcVar22 = pcVar22 + 1
              ) {
            this_00.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
            .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
                 (pcVar22->super_cmLinkItem).Target;
            libTarget = (cmGeneratorTarget *)
                        this_00.
                        super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                        .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
            if (this_00.
                super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl !=
                (_Head_base<0UL,_cmCustomCommand_*,_false>)0x0) {
              this_01 = this->GenTarget;
              cc_1._M_t.
              super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
              super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
              super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
                   (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>
                    )(__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>
                      )this_00.
                       super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                       .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
              local_528 = pcVar22;
              TVar10 = cmGeneratorTarget::GetType(this_01);
              if ((TVar10 == STATIC_LIBRARY) &&
                 (TVar10 = cmGeneratorTarget::GetType
                                     ((cmGeneratorTarget *)
                                      this_00.
                                      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                                      .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl)
                 , TVar10 == STATIC_LIBRARY)) {
                uicDependencies.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (pointer)((ulong)uicDependencies.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish &
                              0xffffffff00000000);
                uicDependencies.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::
                _Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
                _Deque_base((_Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                             *)&tools);
                std::
                _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                ::_M_insert_unique<cmGeneratorTarget_const*const&>
                          ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                            *)&uicDependencies,(cmGeneratorTarget **)&cc_1);
                std::deque<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
                push_back((deque<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                           *)&tools,(value_type *)&cc_1);
                while (local_340._M_nxt != (_Hash_node_base *)tools.field_2._M_allocated_capacity) {
                  this_02 = *(cmGeneratorTarget **)tools.field_2._M_allocated_capacity;
                  std::deque<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ::pop_front((deque<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                               *)&tools);
                  if (this_02 == this_01) {
                    std::
                    _Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                    ::~_Deque_base((_Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                    *)&tools);
                    std::
                    _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                    ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                                 *)&uicDependencies);
                    pcVar22 = local_528;
                    goto LAB_0047704d;
                  }
                  pcVar15 = cmGeneratorTarget::GetLinkImplementationLibraries
                                      (this_02,local_520,Link);
                  if (pcVar15 != (cmLinkImplementationLibraries *)0x0) {
                    pcVar5 = (pcVar15->Libraries).
                             super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                    for (pcVar22 = (pcVar15->Libraries).
                                   super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
                                   ._M_impl.super__Vector_impl_data._M_start; pcVar22 != pcVar5;
                        pcVar22 = pcVar22 + 1) {
                      configView._M_dataplus._M_p = (pointer)(pcVar22->super_cmLinkItem).Target;
                      if ((((cmGeneratorTarget *)configView._M_dataplus._M_p !=
                            (cmGeneratorTarget *)0x0) &&
                          (TVar10 = cmGeneratorTarget::GetType
                                              ((cmGeneratorTarget *)configView._M_dataplus._M_p),
                          TVar10 == STATIC_LIBRARY)) &&
                         (pVar28 = std::
                                   _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                                   ::_M_insert_unique<cmGeneratorTarget_const*const&>
                                             ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                                               *)&uicDependencies,(cmGeneratorTarget **)&configView)
                         , ((undefined1  [16])pVar28 & (undefined1  [16])0x1) !=
                           (undefined1  [16])0x0)) {
                        std::
                        deque<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                        ::push_back((deque<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                     *)&tools,(value_type *)&configView);
                      }
                    }
                  }
                }
                std::
                _Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
                ~_Deque_base((_Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                              *)&tools);
                std::
                _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                             *)&uicDependencies);
              }
              pmVar16 = std::
                        map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                        ::operator[]((map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                                      *)&timestampFileGenex,&libTarget);
              *pmVar16 = *pmVar16 + 1;
              pcVar22 = local_528;
            }
LAB_0047704d:
          }
        }
        psVar13 = local_520 + 1;
      }
      for (uVar17 = timestampFileGenex.field_2._8_8_;
          (size_type *)uVar17 != &timestampFileGenex._M_string_length;
          uVar17 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar17)) {
        if (((_Rb_tree_node_base *)(uVar17 + 0x20))->_M_parent ==
            (_Base_ptr)
            ((long)(this->ConfigsList).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->ConfigsList).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          std::
          _Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
          ::_M_insert_unique<cmTarget*const&>
                    ((_Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
                      *)&(this->AutogenTarget).DependTargets,*(cmTarget ***)(uVar17 + 0x20));
        }
      }
      std::
      _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
      ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                   *)&timestampFileGenex);
    }
    timestampTarget = (cmTarget *)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&dependencies,
               (this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_left,(_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )&(this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header,
               (allocator_type *)&tools);
    if ((char)local_464 != '\0') {
      psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
      cmStrCat<std::__cxx11::string_const&,char_const(&)[24]>
                ((string *)&uicDependencies,psVar13,(char (*) [24])"_autogen_timestamp_deps");
      std::make_unique<cmCustomCommand>();
      cmCustomCommand::SetWorkingDirectory
                ((cmCustomCommand *)
                 cc_3._M_t.
                 super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                 super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                 super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
                 (this->Dir).Work._M_dataplus._M_p);
      _Var9 = cc_3;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_190,&dependencies);
      cmCustomCommand::SetDepends
                ((cmCustomCommand *)
                 _Var9._M_t.
                 super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                 super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                 super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&local_190);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_190);
      cmCustomCommand::SetEscapeOldStyle
                ((cmCustomCommand *)
                 cc_3._M_t.
                 super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                 super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                 super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,false);
      local_438._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
      _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
      super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
           cc_3._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
           _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
           super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
      cc_3._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
      super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
           (__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>)0x0;
      timestampTarget =
           cmLocalGenerator::AddUtilityCommand
                     (this->LocalGen,(string *)&uicDependencies,true,&local_438);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                (&local_438);
      pcVar6 = this->LocalGen;
      std::make_unique<cmGeneratorTarget,cmTarget*&,cmLocalGenerator*&>
                ((cmTarget **)&local_478,(cmLocalGenerator **)&timestampTarget);
      cmLocalGenerator::AddGeneratorTarget(pcVar6,&local_478);
      std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
                (&local_478);
      pcVar19 = timestampTarget;
      if ((this->TargetsFolder)._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&tools,"FOLDER",(allocator<char> *)&timestampFileGenex);
        cmTarget::SetProperty(pcVar19,&tools,(cmValue)&this->TargetsFolder);
        std::__cxx11::string::~string((string *)&tools);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&dependencies);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&dependencies,(value_type *)&uicDependencies);
      AddAutogenExecutableToDependencies(this,local_530,&dependencies);
      AddAutogenExecutableToDependencies(this,&genVars->super_GenVarsT,&dependencies);
      timestampFileGenex._M_dataplus._M_p = (pointer)&timestampFileGenex.field_2;
      timestampFileGenex._M_string_length = 0;
      cc_1._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
      super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
           &local_540;
      timestampFileGenex.field_2._M_allocated_capacity =
           timestampFileGenex.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_540._M_local_buf[0] = '\0';
      if ((this->MultiConfig == true) && (this->UseBetterGraph == true)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&configView,"$<CONFIG>",(allocator<char> *)&tools);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&libTarget,"timestamp_",(allocator<char> *)&tools);
        psVar13 = &(this->Dir).Build;
        cmStrCat<std::__cxx11::string&,char_const(&)[7]>
                  (&depFileWithoutConfig,psVar13,(char (*) [7])"/deps_");
        std::operator+(&timestampFileName,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &libTarget,&configView);
        cmStrCat<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&>
                  (&tools,psVar13,(char (*) [2])0x746d41,&timestampFileName);
        std::__cxx11::string::operator=((string *)&timestampFileGenex,(string *)&tools);
        std::__cxx11::string::~string((string *)&tools);
        cmStrCat<std::__cxx11::string_const&,std::__cxx11::string_const&>
                  (&depFileWithConfig,&depFileWithoutConfig,&configView);
        std::__cxx11::string::_M_assign((string *)&cc_1);
        psVar13 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        tools._M_string_length = (size_type)(psVar13->_M_dataplus)._M_p;
        tools._M_dataplus._M_p = (pointer)psVar13->_M_string_length;
        tools.field_2._M_allocated_capacity = 2;
        tools.field_2._8_8_ = anon_var_dwarf_10800;
        local_350 = (pointer)0x5;
        local_348 = (pointer)0x6867a8;
        local_340._M_nxt = (_Hash_node_base *)timestampFileGenex._M_string_length;
        pbStack_338 = (pointer)timestampFileGenex._M_dataplus._M_p;
        ilist._M_len = 4;
        ilist._M_array = (iterator)&tools;
        cmMakeCommandLine((cmCustomCommandLine *)&tempTimestampFileName,ilist);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
        emplace_back<cmCustomCommandLine>
                  (&commandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                   (cmCustomCommandLine *)&tempTimestampFileName);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&tempTimestampFileName);
        tools._M_dataplus._M_p = (pointer)&tools.field_2;
        tools._M_string_length = 0;
        tools.field_2._M_allocated_capacity =
             tools.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_350 = abStack_320;
        local_348 = (pointer)0x1;
        local_340._M_nxt = (_Hash_node_base *)0x0;
        pbStack_338 = (pointer)0x0;
        local_330 = 1.0;
        local_328 = (pointer)0x0;
        abStack_320[0]._M_dataplus._M_p = (pointer)0x0;
        pbVar7 = (this->ConfigsList).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_520 = &(this->Dir).RelativeBuild;
        local_528 = (pointer)&(this->AutogenTarget).DepFileRuleName.Config;
        for (pbVar27 = (this->ConfigsList).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar27 != pbVar7;
            pbVar27 = pbVar27 + 1) {
          std::operator+(&tempTimestampFileName,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &libTarget,pbVar27);
          std::operator+(&tempDepFile,&depFileWithoutConfig,pbVar27);
          pmVar18 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&local_350,pbVar27);
          std::__cxx11::string::_M_assign((string *)pmVar18);
          cmStrCat<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                    (&local_70,local_520,(char (*) [2])0x746d41,&tempTimestampFileName);
          pmVar18 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_528,pbVar27);
          std::__cxx11::string::operator=((string *)pmVar18,(string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          pmVar18 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&(this->AutogenTarget).DepFile.Config,pbVar27);
          std::__cxx11::string::_M_assign((string *)pmVar18);
          std::__cxx11::string::~string((string *)&tempDepFile);
          std::__cxx11::string::~string((string *)&tempTimestampFileName);
        }
        AddGeneratedSource(this,(ConfigString *)&tools,local_530,false);
        cmQtAutoGen::ConfigString::~ConfigString((ConfigString *)&tools);
        std::__cxx11::string::~string((string *)&depFileWithConfig);
        std::__cxx11::string::~string((string *)&timestampFileName);
        std::__cxx11::string::~string((string *)&depFileWithoutConfig);
        std::__cxx11::string::~string((string *)&libTarget);
        std::__cxx11::string::~string((string *)&configView);
      }
      else {
        libTarget = (cmGeneratorTarget *)0x9;
        local_3c8 = "timestamp";
        psVar13 = &(this->Dir).Build;
        cmStrCat<std::__cxx11::string&,char_const(&)[2],std::basic_string_view<char,std::char_traits<char>>const&>
                  (&tools,psVar13,(char (*) [2])0x746d41,
                   (basic_string_view<char,_std::char_traits<char>_> *)&libTarget);
        std::__cxx11::string::operator=((string *)&timestampFileGenex,(string *)&tools);
        std::__cxx11::string::~string((string *)&tools);
        cmStrCat<std::__cxx11::string&,char_const(&)[6]>(&tools,psVar13,(char (*) [6])"/deps");
        std::__cxx11::string::operator=((string *)&(this->AutogenTarget).DepFile,(string *)&tools);
        std::__cxx11::string::~string((string *)&tools);
        std::__cxx11::string::_M_assign((string *)&cc_1);
        cmStrCat<std::__cxx11::string&,char_const(&)[2],std::basic_string_view<char,std::char_traits<char>>const&>
                  (&tools,&(this->Dir).RelativeBuild,(char (*) [2])0x746d41,
                   (basic_string_view<char,_std::char_traits<char>_> *)&libTarget);
        std::__cxx11::string::operator=
                  ((string *)&(this->AutogenTarget).DepFileRuleName,(string *)&tools);
        std::__cxx11::string::~string((string *)&tools);
        psVar13 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        tools._M_string_length = (size_type)(psVar13->_M_dataplus)._M_p;
        tools._M_dataplus._M_p = (pointer)psVar13->_M_string_length;
        tools.field_2._M_allocated_capacity = 2;
        tools.field_2._8_8_ = anon_var_dwarf_10800;
        local_350 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5;
        local_348 = (pointer)0x6867a8;
        local_340._M_nxt = (_Hash_node_base *)timestampFileGenex._M_string_length;
        pbStack_338 = (pointer)timestampFileGenex._M_dataplus._M_p;
        ilist_01._M_len = 4;
        ilist_01._M_array = (iterator)&tools;
        cmMakeCommandLine((cmCustomCommandLine *)&configView,ilist_01);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
        emplace_back<cmCustomCommandLine>
                  (&commandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                   (cmCustomCommandLine *)&configView);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&configView);
        AddGeneratedSource(this,&timestampFileGenex,local_530,false);
      }
      std::make_unique<cmCustomCommand>();
      _Var26 = tools._M_dataplus;
      tools._M_dataplus._M_p = (pointer)0x0;
      std::__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::reset
                ((__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&cc_3,
                 (pointer)_Var26._M_p);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&tools);
      _Var9 = cc_3;
      std::__cxx11::string::string((string *)&local_f0,(string *)&timestampFileGenex);
      cmCustomCommand::SetOutputs
                ((cmCustomCommand *)
                 _Var9._M_t.
                 super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                 super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                 super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      _Var9 = cc_3;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1a8,&timestampByproducts);
      cmCustomCommand::SetByproducts
                ((cmCustomCommand *)
                 _Var9._M_t.
                 super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                 super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                 super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&local_1a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1a8);
      _Var9 = cc_3;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1c0,&dependencies);
      cmCustomCommand::SetDepends
                ((cmCustomCommand *)
                 _Var9._M_t.
                 super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                 super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                 super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&local_1c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1c0);
      _Var9 = cc_3;
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                (&local_1d8,
                 &commandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
      cmCustomCommand::SetCommandLines
                ((cmCustomCommand *)
                 _Var9._M_t.
                 super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                 super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                 super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
                 (cmCustomCommandLines *)&local_1d8);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_1d8);
      cmCustomCommand::SetComment
                ((cmCustomCommand *)
                 cc_3._M_t.
                 super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                 super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                 super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
                 autogenComment._M_dataplus._M_p);
      cmCustomCommand::SetWorkingDirectory
                ((cmCustomCommand *)
                 cc_3._M_t.
                 super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                 super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                 super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
                 (this->Dir).Work._M_dataplus._M_p);
      cmCustomCommand::SetEscapeOldStyle
                ((cmCustomCommand *)
                 cc_3._M_t.
                 super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                 super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                 super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,false);
      cmCustomCommand::SetDepfile
                ((cmCustomCommand *)
                 cc_3._M_t.
                 super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                 super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                 super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,(string *)&cc_1);
      *(undefined1 *)
       ((long)cc_3._M_t.
              super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
              super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
              super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl + 0x12e) = 1;
      local_440._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
      _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
      super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
           cc_3._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
           _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
           super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
      cc_3._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
      super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
           (__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>)0x0;
      cmLocalGenerator::AddCustomCommandToOutput(this->LocalGen,&local_440,false);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                (&local_440);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&dependencies);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&dependencies,
                 &timestampFileGenex);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::clear
                (&commandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
      autogenComment._M_string_length = 0;
      *autogenComment._M_dataplus._M_p = '\0';
      std::__cxx11::string::~string((string *)&cc_1);
      std::__cxx11::string::~string((string *)&timestampFileGenex);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&cc_3);
      std::__cxx11::string::~string((string *)&uicDependencies);
    }
    std::make_unique<cmCustomCommand>();
    cmCustomCommand::SetWorkingDirectory
              ((cmCustomCommand *)
               uicDependencies.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,(this->Dir).Work._M_dataplus._M_p);
    pbVar27 = uicDependencies.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1f0,&autogenByproducts);
    cmCustomCommand::SetByproducts((cmCustomCommand *)pbVar27,&local_1f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1f0);
    pbVar27 = uicDependencies.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_208,&dependencies);
    cmCustomCommand::SetDepends((cmCustomCommand *)pbVar27,&local_208);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_208);
    pbVar27 = uicDependencies.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
              (&local_220,
               &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
              );
    cmCustomCommand::SetCommandLines((cmCustomCommand *)pbVar27,(cmCustomCommandLines *)&local_220);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_220);
    cmCustomCommand::SetEscapeOldStyle
              ((cmCustomCommand *)
               uicDependencies.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,false);
    cmCustomCommand::SetComment
              ((cmCustomCommand *)
               uicDependencies.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,autogenComment._M_dataplus._M_p);
    utilityName = &this->AutogenTarget;
    local_448._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
    _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         uicDependencies.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    uicDependencies.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pcVar19 = cmLocalGenerator::AddUtilityCommand(this->LocalGen,&utilityName->Name,true,&local_448)
    ;
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_448)
    ;
    pcVar6 = this->LocalGen;
    timestampFileGenex._M_dataplus._M_p = (pointer)pcVar19;
    std::make_unique<cmGeneratorTarget,cmTarget*&,cmLocalGenerator*&>
              ((cmTarget **)&local_480,(cmLocalGenerator **)&timestampFileGenex);
    cmLocalGenerator::AddGeneratorTarget(pcVar6,&local_480);
    std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
              (&local_480);
    _Var26._M_p = (pointer)timestampTarget;
    if (timestampTarget == (cmTarget *)0x0) {
      _Var26 = timestampFileGenex._M_dataplus;
    }
    if ((this->AutogenTarget).DependOrigin == true) {
      psVar20 = cmGeneratorTarget::GetUtilities_abi_cxx11_(this->GenTarget);
      for (p_Var21 = (psVar20->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var21 != &(psVar20->_M_t)._M_impl.super__Rb_tree_header;
          p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21)) {
        cmTarget::AddUtility((cmTarget *)_Var26._M_p,(string *)(p_Var21 + 1),false,this->Makefile);
      }
    }
    for (p_Var21 = (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_left; this_03._M_p = timestampFileGenex._M_dataplus._M_p,
        (_Rb_tree_header *)p_Var21 !=
        &(this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header;
        p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21)) {
      psVar13 = cmTarget::GetName_abi_cxx11_(*(cmTarget **)(p_Var21 + 1));
      cmTarget::AddUtility((cmTarget *)_Var26._M_p,psVar13,false,this->Makefile);
    }
    if ((this->TargetsFolder)._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tools,"FOLDER",(allocator<char> *)&cc_1);
      cmTarget::SetProperty((cmTarget *)this_03._M_p,&tools,(cmValue)&this->TargetsFolder);
      std::__cxx11::string::~string((string *)&tools);
    }
    cmTarget::AddUtility(this->GenTarget->Target,&utilityName->Name,false,this->Makefile);
    if ((this->AutogenTarget).GlobalTarget == true) {
      cmQtAutoGenGlobalInitializer::AddToGlobalAutoGen
                (this->GlobalInitializer,this->LocalGen,&utilityName->Name);
    }
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
               &uicDependencies);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&dependencies);
  }
  else {
    for (p_Var14 = (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_left;
        (_Rb_tree_header *)p_Var14 !=
        &(this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header;
        p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
      pcVar19 = this->GenTarget->Target;
      psVar13 = cmTarget::GetName_abi_cxx11_(*(cmTarget **)(p_Var14 + 1));
      cmTarget::AddUtility(pcVar19,psVar13,false,this->Makefile);
    }
    if (((this->Uic).UiFilesNoOptions.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->Uic).UiFilesNoOptions.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       ((this->Uic).UiFilesWithOptions.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->Uic).UiFilesWithOptions.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      local_350 = abStack_320;
      tools._M_dataplus._M_p = (pointer)&tools.field_2;
      tools._M_string_length = 0;
      tools.field_2._M_allocated_capacity = tools.field_2._M_allocated_capacity & 0xffffffffffffff00
      ;
      local_348 = (pointer)0x1;
      local_340._M_nxt = (_Hash_node_base *)0x0;
      pbStack_338 = (pointer)0x0;
      timestampFileGenex._M_dataplus._M_p = (pointer)&timestampFileGenex.field_2;
      timestampFileGenex._M_string_length = 0;
      local_330 = 1.0;
      local_328 = (pointer)0x0;
      abStack_320[0]._M_dataplus._M_p = (pointer)0x0;
      timestampFileGenex.field_2._M_allocated_capacity =
           timestampFileGenex.field_2._M_allocated_capacity & 0xffffffffffffff00;
      cc_1._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
      super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
           (__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>)0x8;
      cmStrCat<std::__cxx11::string&,cm::static_string_view>
                ((string *)&uicDependencies,&(this->Dir).Build,(static_string_view *)&cc_1);
      local_230 = (__buckets_ptr)&DAT_00000006;
      pcStack_228 = ".stamp";
      suffix._M_str = ".stamp";
      suffix._M_len = 6;
      prefix._M_str =
           (char *)uicDependencies.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      prefix._M_len =
           (size_t)uicDependencies.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      ConfigFileNamesAndGenex(this,(ConfigString *)&tools,&timestampFileGenex,prefix,suffix);
      std::__cxx11::string::~string((string *)&uicDependencies);
      AddGeneratedSource(this,(ConfigString *)&tools,&genVars->super_GenVarsT,false);
      psVar13 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      uicDependencies.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)(psVar13->_M_dataplus)._M_p;
      uicDependencies.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar13->_M_string_length;
      uicDependencies.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
      ilist_00._M_len = 4;
      ilist_00._M_array = (iterator)&uicDependencies;
      cmMakeCommandLine((cmCustomCommandLine *)&cc_1,ilist_00);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
      emplace_back<cmCustomCommandLine>
                (&commandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                 (cmCustomCommandLine *)&cc_1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cc_1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&uicDependencies,&(this->Uic).UiFilesNoOptions);
      ppVar8 = (this->Uic).UiFilesWithOptions.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__x = (this->Uic).UiFilesWithOptions.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __x != ppVar8; __x = __x + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&uicDependencies,&__x->first);
      }
      AddAutogenExecutableToDependencies(this,&genVars->super_GenVarsT,&uicDependencies);
      std::make_unique<cmCustomCommand>();
      _Var9 = cc_1;
      std::__cxx11::string::string((string *)&local_90,(string *)&timestampFileGenex);
      cmCustomCommand::SetOutputs
                ((cmCustomCommand *)
                 _Var9._M_t.
                 super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                 super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                 super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      _Var9 = cc_1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_148,&uicDependencies);
      cmCustomCommand::SetDepends
                ((cmCustomCommand *)
                 _Var9._M_t.
                 super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                 super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                 super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&local_148);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_148);
      cmCustomCommand::SetComment
                ((cmCustomCommand *)
                 cc_1._M_t.
                 super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                 super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                 super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,"");
      cmCustomCommand::SetWorkingDirectory
                ((cmCustomCommand *)
                 cc_1._M_t.
                 super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                 super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                 super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
                 (this->Dir).Work._M_dataplus._M_p);
      cmCustomCommand::SetEscapeOldStyle
                ((cmCustomCommand *)
                 cc_1._M_t.
                 super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                 super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                 super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,false);
      *(undefined1 *)
       ((long)cc_1._M_t.
              super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
              super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
              super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl + 0x12e) = 1;
      local_430._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
      _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
      super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
           cc_1._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
           _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
           super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
      cc_1._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
      super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
           (__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>)0x0;
      cmLocalGenerator::AddCustomCommandToOutput(this->LocalGen,&local_430,false);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                (&local_430);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&cc_1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&uicDependencies);
      std::__cxx11::string::~string((string *)&timestampFileGenex);
      cmQtAutoGen::ConfigString::~ConfigString((ConfigString *)&tools);
    }
    cmCustomCommand::cmCustomCommand((cmCustomCommand *)&tools);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_160,&autogenByproducts);
    cmCustomCommand::SetByproducts((cmCustomCommand *)&tools,&local_160);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_160);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
              (&local_178,
               &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
              );
    cmCustomCommand::SetCommandLines((cmCustomCommand *)&tools,(cmCustomCommandLines *)&local_178);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_178);
    cmCustomCommand::SetComment((cmCustomCommand *)&tools,autogenComment._M_dataplus._M_p);
    cmMakefile::GetBacktrace((cmMakefile *)local_380);
    cmCustomCommand::SetBacktrace((cmCustomCommand *)&tools,(cmListFileBacktrace *)local_380);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_380 + 8));
    cmCustomCommand::SetWorkingDirectory
              ((cmCustomCommand *)&tools,(this->Dir).Work._M_dataplus._M_p);
    local_242 = true;
    cmCustomCommand::SetEscapeOldStyle((cmCustomCommand *)&tools,false);
    cmCustomCommand::SetEscapeAllowMakeVars((cmCustomCommand *)&tools,true);
    cmTarget::AddPreBuildCommand(this->GenTarget->Target,(cmCustomCommand *)&tools);
    cmCustomCommand::~cmCustomCommand((cmCustomCommand *)&tools);
  }
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  std::__cxx11::string::~string((string *)&autogenComment);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&timestampByproducts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&autogenByproducts);
  return true;
}

Assistant:

bool cmQtAutoGenInitializer::InitAutogenTarget()
{
  // Register info file as generated by CMake
  this->Makefile->AddCMakeOutputFile(this->AutogenTarget.InfoFile);

  // Determine whether to use a depfile for the AUTOGEN target.
  bool const useDepfile = [this]() -> bool {
    auto const& gen = this->GlobalGen->GetName();
    return this->QtVersion >= IntegerVersion(5, 15) &&
      (gen.find("Ninja") != std::string::npos ||
       gen.find("Make") != std::string::npos);
  }();

  // Files provided by the autogen target
  std::vector<std::string> autogenByproducts;
  std::vector<std::string> timestampByproducts;
  if (this->Moc.Enabled) {
    this->AddGeneratedSource(this->Moc.CompilationFile, this->Moc, true);
    if (useDepfile) {
      if (this->CrossConfig &&
          this->GlobalGen->GetName().find("Ninja") != std::string::npos &&
          !this->UseBetterGraph) {
        // Make all mocs_compilation_<CONFIG>.cpp files byproducts of the
        // ${target}_autogen/timestamp custom command.
        // We cannot just use Moc.CompilationFileGenex here, because that
        // custom command runs cmake_autogen for each configuration.
        for (const auto& p : this->Moc.CompilationFile.Config) {
          timestampByproducts.push_back(p.second);
        }
      } else {
        timestampByproducts.push_back(this->Moc.CompilationFileGenex);
      }
    } else {
      autogenByproducts.push_back(this->Moc.CompilationFileGenex);
    }
  }

  if (this->Uic.Enabled) {
    for (const auto& file : this->Uic.UiHeaders) {
      this->AddGeneratedSource(file.first, this->Uic);
      autogenByproducts.push_back(file.second);
    }
  }

  // Compose target comment
  std::string autogenComment;
  {
    std::string tools;
    if (this->Moc.Enabled) {
      tools += "MOC";
    }
    if (this->Uic.Enabled) {
      if (!tools.empty()) {
        tools += " and ";
      }
      tools += "UIC";
    }
    autogenComment = cmStrCat("Automatic ", tools, " for target ",
                              this->GenTarget->GetName());
  }

  // Compose command lines
  // FIXME: Take advantage of our per-config mocs_compilation_$<CONFIG>.cpp
  // instead of fiddling with the include directories

  bool constexpr stdPipesUTF8 = true;
  cmCustomCommandLines commandLines;
  AddCMakeProcessToCommandLines(this->AutogenTarget.InfoFile, "cmake_autogen",
                                commandLines);

  // Use PRE_BUILD on demand
  bool usePRE_BUILD = false;
  if (this->GlobalGen->GetName().find("Visual Studio") != std::string::npos) {
    // Under VS use a PRE_BUILD event instead of a separate target to
    // reduce the number of targets loaded into the IDE.
    // This also works around a VS 11 bug that may skip updating the target:
    //  https://connect.microsoft.com/VisualStudio/feedback/details/769495
    usePRE_BUILD = true;
  }
  // Disable PRE_BUILD in some cases
  if (usePRE_BUILD) {
    // Cannot use PRE_BUILD with file depends
    if (!this->AutogenTarget.DependFiles.empty()) {
      usePRE_BUILD = false;
    }
    // Cannot use PRE_BUILD when a global autogen target is in place
    if (this->AutogenTarget.GlobalTarget) {
      usePRE_BUILD = false;
    }
  }
  // Create the autogen target/command
  if (usePRE_BUILD) {
    // Add additional autogen target dependencies to origin target
    for (cmTarget const* depTarget : this->AutogenTarget.DependTargets) {
      this->GenTarget->Target->AddUtility(depTarget->GetName(), false,
                                          this->Makefile);
    }

    if (!this->Uic.UiFilesNoOptions.empty() ||
        !this->Uic.UiFilesWithOptions.empty()) {
      // Add a generated timestamp file
      ConfigString timestampFile;
      std::string timestampFileGenex;
      ConfigFileNamesAndGenex(timestampFile, timestampFileGenex,
                              cmStrCat(this->Dir.Build, "/autouic"_s),
                              ".stamp"_s);
      this->AddGeneratedSource(timestampFile, this->Uic);

      // Add a step in the pre-build command to touch the timestamp file
      commandLines.push_back(
        cmMakeCommandLine({ cmSystemTools::GetCMakeCommand(), "-E", "touch",
                            timestampFileGenex }));

      // UIC needs to be re-run if any of the known UI files change or the
      // executable itself has been updated
      auto uicDependencies = this->Uic.UiFilesNoOptions;
      for (auto const& uiFile : this->Uic.UiFilesWithOptions) {
        uicDependencies.push_back(uiFile.first);
      }
      AddAutogenExecutableToDependencies(this->Uic, uicDependencies);

      // Add a rule file to cause the target to build if a dependency has
      // changed, which will trigger the pre-build command to run autogen
      auto cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(timestampFileGenex);
      cc->SetDepends(uicDependencies);
      cc->SetComment("");
      cc->SetWorkingDirectory(this->Dir.Work.c_str());
      cc->SetEscapeOldStyle(false);
      cc->SetStdPipesUTF8(stdPipesUTF8);
      this->LocalGen->AddCustomCommandToOutput(std::move(cc));
    }

    // Add the pre-build command directly to bypass the OBJECT_LIBRARY
    // rejection in cmMakefile::AddCustomCommandToTarget because we know
    // PRE_BUILD will work for an OBJECT_LIBRARY in this specific case.
    //
    // PRE_BUILD does not support file dependencies!
    cmCustomCommand cc;
    cc.SetByproducts(autogenByproducts);
    cc.SetCommandLines(commandLines);
    cc.SetComment(autogenComment.c_str());
    cc.SetBacktrace(this->Makefile->GetBacktrace());
    cc.SetWorkingDirectory(this->Dir.Work.c_str());
    cc.SetStdPipesUTF8(stdPipesUTF8);
    cc.SetEscapeOldStyle(false);
    cc.SetEscapeAllowMakeVars(true);
    this->GenTarget->Target->AddPreBuildCommand(std::move(cc));
  } else {

    // Add link library target dependencies to the autogen target
    // dependencies
    if (this->AutogenTarget.DependOrigin) {
      // add_dependencies/addUtility do not support generator expressions.
      // We depend only on the libraries found in all configs therefore.
      std::map<cmGeneratorTarget const*, std::size_t> commonTargets;
      for (std::string const& config : this->ConfigsList) {
        cmLinkImplementationLibraries const* libs =
          this->GenTarget->GetLinkImplementationLibraries(
            config, cmGeneratorTarget::LinkInterfaceFor::Link);
        if (libs) {
          for (cmLinkItem const& item : libs->Libraries) {
            cmGeneratorTarget const* libTarget = item.Target;
            if (libTarget &&
                !StaticLibraryCycle(this->GenTarget, libTarget, config)) {
              // Increment target config count
              commonTargets[libTarget]++;
            }
          }
        }
      }
      for (auto const& item : commonTargets) {
        if (item.second == this->ConfigsList.size()) {
          this->AutogenTarget.DependTargets.insert(item.first->Target);
        }
      }
    }

    cmTarget* timestampTarget = nullptr;
    std::vector<std::string> dependencies(
      this->AutogenTarget.DependFiles.begin(),
      this->AutogenTarget.DependFiles.end());
    if (useDepfile) {
      // Create a custom command that generates a timestamp file and
      // has a depfile assigned. The depfile is created by JobDepFilesMergeT.
      //
      // Also create an additional '_autogen_timestamp_deps' that the custom
      // command will depend on. It will have no sources or commands to
      // execute, but it will have dependencies that would originally be
      // assigned to the pre-Qt 5.15 'autogen' target. These dependencies will
      // serve as a list of order-only dependencies for the custom command,
      // without forcing the custom command to re-execute.
      //
      // The dependency tree would then look like
      // '_autogen_timestamp_deps (order-only)' <- '/timestamp' file <-
      // '_autogen' target.
      const auto timestampTargetName =
        cmStrCat(this->GenTarget->GetName(), "_autogen_timestamp_deps");

      auto cc = cm::make_unique<cmCustomCommand>();
      cc->SetWorkingDirectory(this->Dir.Work.c_str());
      cc->SetDepends(dependencies);
      cc->SetEscapeOldStyle(false);
      timestampTarget = this->LocalGen->AddUtilityCommand(timestampTargetName,
                                                          true, std::move(cc));

      this->LocalGen->AddGeneratorTarget(
        cm::make_unique<cmGeneratorTarget>(timestampTarget, this->LocalGen));

      // Set FOLDER property on the timestamp target, so it appears in the
      // appropriate folder in an IDE or in the file api.
      if (!this->TargetsFolder.empty()) {
        timestampTarget->SetProperty("FOLDER", this->TargetsFolder);
      }

      // Make '/timestamp' file depend on '_autogen_timestamp_deps' and on the
      // moc and uic executables (whichever are enabled).
      dependencies.clear();
      dependencies.push_back(timestampTargetName);

      AddAutogenExecutableToDependencies(this->Moc, dependencies);
      AddAutogenExecutableToDependencies(this->Uic, dependencies);
      std::string outputFile;
      std::string depFile;
      // Create the custom command that outputs the timestamp file.
      if (this->MultiConfig && this->UseBetterGraph) {
        // create timestamp file with $<CONFIG> in the name so that
        // every cmake_autogen target has its own timestamp file
        std::string const configView = "$<CONFIG>";
        std::string const timestampFileWithoutConfig = "timestamp_";
        std::string const depFileWithoutConfig =
          cmStrCat(this->Dir.Build, "/deps_");
        std::string const timestampFileName =
          timestampFileWithoutConfig + configView;
        outputFile = cmStrCat(this->Dir.Build, "/", timestampFileName);
        auto const depFileWithConfig =
          cmStrCat(depFileWithoutConfig, configView);
        depFile = depFileWithConfig;
        commandLines.push_back(cmMakeCommandLine(
          { cmSystemTools::GetCMakeCommand(), "-E", "touch", outputFile }));

        ConfigString outputFileWithConfig;
        for (std::string const& config : this->ConfigsList) {
          auto tempTimestampFileName = timestampFileWithoutConfig + config;
          auto tempDepFile = depFileWithoutConfig + config;
          outputFileWithConfig.Config[config] = tempTimestampFileName;
          this->AutogenTarget.DepFileRuleName.Config[config] =
            cmStrCat(this->Dir.RelativeBuild, "/", tempTimestampFileName);
          this->AutogenTarget.DepFile.Config[config] = tempDepFile;
        }
        this->AddGeneratedSource(outputFileWithConfig, this->Moc);
      } else {
        cm::string_view const timestampFileName = "timestamp";
        outputFile = cmStrCat(this->Dir.Build, "/", timestampFileName);
        this->AutogenTarget.DepFile.Default =
          cmStrCat(this->Dir.Build, "/deps");
        depFile = this->AutogenTarget.DepFile.Default;
        this->AutogenTarget.DepFileRuleName.Default =
          cmStrCat(this->Dir.RelativeBuild, "/", timestampFileName);
        commandLines.push_back(cmMakeCommandLine(
          { cmSystemTools::GetCMakeCommand(), "-E", "touch", outputFile }));
        this->AddGeneratedSource(outputFile, this->Moc);
      }
      cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(outputFile);
      cc->SetByproducts(timestampByproducts);
      cc->SetDepends(dependencies);
      cc->SetCommandLines(commandLines);
      cc->SetComment(autogenComment.c_str());
      cc->SetWorkingDirectory(this->Dir.Work.c_str());
      cc->SetEscapeOldStyle(false);
      cc->SetDepfile(depFile);
      cc->SetStdPipesUTF8(stdPipesUTF8);
      this->LocalGen->AddCustomCommandToOutput(std::move(cc));
      dependencies.clear();
      dependencies.emplace_back(std::move(outputFile));
      commandLines.clear();
      autogenComment.clear();
    }

    // Create autogen target
    auto cc = cm::make_unique<cmCustomCommand>();
    cc->SetWorkingDirectory(this->Dir.Work.c_str());
    cc->SetByproducts(autogenByproducts);
    cc->SetDepends(dependencies);
    cc->SetCommandLines(commandLines);
    cc->SetEscapeOldStyle(false);
    cc->SetComment(autogenComment.c_str());
    cmTarget* autogenTarget = this->LocalGen->AddUtilityCommand(
      this->AutogenTarget.Name, true, std::move(cc));
    // Create autogen generator target
    this->LocalGen->AddGeneratorTarget(
      cm::make_unique<cmGeneratorTarget>(autogenTarget, this->LocalGen));

    // Order the autogen target(s) just before the original target.
    cmTarget* orderTarget = timestampTarget ? timestampTarget : autogenTarget;
    // Forward origin utilities to autogen target
    if (this->AutogenTarget.DependOrigin) {
      for (BT<std::pair<std::string, bool>> const& depName :
           this->GenTarget->GetUtilities()) {
        orderTarget->AddUtility(depName.Value.first, false, this->Makefile);
      }
    }

    // Add additional autogen target dependencies to autogen target
    for (cmTarget const* depTarget : this->AutogenTarget.DependTargets) {
      orderTarget->AddUtility(depTarget->GetName(), false, this->Makefile);
    }

    // Set FOLDER property in autogen target
    if (!this->TargetsFolder.empty()) {
      autogenTarget->SetProperty("FOLDER", this->TargetsFolder);
    }

    // Add autogen target to the origin target dependencies
    this->GenTarget->Target->AddUtility(this->AutogenTarget.Name, false,
                                        this->Makefile);

    // Add autogen target to the global autogen target dependencies
    if (this->AutogenTarget.GlobalTarget) {
      this->GlobalInitializer->AddToGlobalAutoGen(this->LocalGen,
                                                  this->AutogenTarget.Name);
    }
  }

  return true;
}